

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  SymbolsByNameSet *this_00;
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base _Var3;
  _Hash_node_base *p_Var4;
  StringPiece x;
  bool bVar5;
  __hash_code __c;
  __node_ptr p_Var6;
  __node_ptr p_Var7;
  __node_base_ptr *pp_Var8;
  __node_base_ptr *pp_Var9;
  ulong uVar10;
  size_t __bkt_count;
  ulong uVar11;
  __node_base _Var12;
  StringPiece y;
  undefined1 auVar13 [16];
  LogFinisher local_a1;
  Symbol symbol_local;
  SymbolsByNameSet *local_78;
  __node_ptr local_70;
  StringPiece local_40;
  
  symbol_local = symbol;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_40,full_name);
  y = Symbol::full_name(&symbol_local);
  x.length_ = local_40.length_;
  x.ptr_ = local_40.ptr_;
  bVar5 = stringpiece_internal::operator==(x,y);
  if (!bVar5) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x679);
    local_40.length_ =
         (size_type)
         internal::LogMessage::operator<<
                   ((LogMessage *)&local_78,"CHECK failed: (full_name) == (symbol.full_name()): ");
    internal::LogFinisher::operator=(&local_a1,(LogMessage *)local_40.length_);
    internal::LogMessage::~LogMessage((LogMessage *)&local_78);
  }
  this_00 = &this->symbols_by_name_;
  __c = std::__detail::
        _Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
        ::_M_hash_code((_Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                        *)&symbol_local,(Symbol *)local_40.length_);
  uVar10 = __c % (this->symbols_by_name_)._M_h._M_bucket_count;
  p_Var6 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar10,(key_type *)&symbol_local,__c);
  if (p_Var6 == (__node_ptr)0x0) {
    p_Var7 = std::__detail::
             _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::Symbol,true>>>
             ::_M_allocate_node<google::protobuf::Symbol_const&>
                       ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::Symbol,true>>>
                         *)this_00,&symbol_local);
    local_78 = this_00;
    local_70 = p_Var7;
    auVar13 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->symbols_by_name_)._M_h._M_rehash_policy,
                         (this->symbols_by_name_)._M_h._M_bucket_count,
                         (this->symbols_by_name_)._M_h._M_element_count);
    __bkt_count = auVar13._8_8_;
    if ((auVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pp_Var8 = (this_00->_M_h)._M_buckets;
    }
    else {
      if (__bkt_count == 1) {
        pp_Var8 = &(this->symbols_by_name_)._M_h._M_single_bucket;
        (this->symbols_by_name_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        pp_Var8 = std::__detail::
                  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::Symbol,_true>_>_>
                  ::_M_allocate_buckets
                            ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::Symbol,_true>_>_>
                              *)this_00,__bkt_count);
      }
      p_Var1 = &(this->symbols_by_name_)._M_h._M_before_begin;
      _Var3._M_nxt = (this->symbols_by_name_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_name_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      uVar10 = 0;
LAB_00356f00:
      _Var12._M_nxt = _Var3._M_nxt;
      uVar11 = uVar10;
      if (_Var12._M_nxt != (_Hash_node_base *)0x0) {
        _Var3._M_nxt = (_Var12._M_nxt)->_M_nxt;
        uVar10 = (ulong)_Var12._M_nxt[2]._M_nxt % __bkt_count;
        if (pp_Var8[uVar10] == (__node_base_ptr)0x0) goto LAB_00356f2f;
        (_Var12._M_nxt)->_M_nxt = pp_Var8[uVar10]->_M_nxt;
        pp_Var9 = &pp_Var8[uVar10]->_M_nxt;
        uVar10 = uVar11;
        goto LAB_00356f46;
      }
      std::
      _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_deallocate_buckets(&this_00->_M_h);
      (this->symbols_by_name_)._M_h._M_bucket_count = __bkt_count;
      (this->symbols_by_name_)._M_h._M_buckets = pp_Var8;
      uVar10 = __c % __bkt_count;
    }
    (p_Var7->super__Hash_node_value<google::protobuf::Symbol,_true>).
    super__Hash_node_code_cache<true>._M_hash_code = __c;
    if (pp_Var8[uVar10] == (__node_base_ptr)0x0) {
      (p_Var7->super__Hash_node_base)._M_nxt = (this->symbols_by_name_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_name_)._M_h._M_before_begin._M_nxt = &p_Var7->super__Hash_node_base;
      p_Var4 = (p_Var7->super__Hash_node_base)._M_nxt;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        pp_Var8[(ulong)p_Var4[2]._M_nxt % (this->symbols_by_name_)._M_h._M_bucket_count] =
             &p_Var7->super__Hash_node_base;
        pp_Var8 = (this->symbols_by_name_)._M_h._M_buckets;
      }
      pp_Var8[uVar10] = &(this->symbols_by_name_)._M_h._M_before_begin;
    }
    else {
      (p_Var7->super__Hash_node_base)._M_nxt = pp_Var8[uVar10]->_M_nxt;
      pp_Var8[uVar10]->_M_nxt = &p_Var7->super__Hash_node_base;
    }
    psVar2 = &(this->symbols_by_name_)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    local_70 = (__node_ptr)0x0;
    std::
    _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_Scoped_node::~_Scoped_node((_Scoped_node *)&local_78);
    local_78 = (SymbolsByNameSet *)(full_name->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->symbols_after_checkpoint_,
               (char **)&local_78);
  }
  return p_Var6 == (__node_ptr)0x0;
LAB_00356f2f:
  (_Var12._M_nxt)->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = _Var12._M_nxt;
  pp_Var8[uVar10] = p_Var1;
  if ((_Var12._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var9 = pp_Var8 + uVar11;
LAB_00356f46:
    *pp_Var9 = _Var12._M_nxt;
  }
  goto LAB_00356f00;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(const std::string& full_name,
                                       Symbol symbol) {
  GOOGLE_DCHECK_EQ(full_name, symbol.full_name());
  if (symbols_by_name_.insert(symbol).second) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}